

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

int32_t icu_63::number::impl::AffixUtils::unescapedCodePointCount
                  (UnicodeString *affixPattern,SymbolProvider *provider,UErrorCode *status)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  UErrorCode *in_R8;
  AffixTag tag;
  AffixTag AVar4;
  AffixTag local_80;
  UnicodeString local_70;
  
  AVar4 = local_80;
  local_80._0_8_ = local_80._4_8_ << 0x20;
  local_80.type = AVar4.type;
  local_80.state = STATE_BASE;
  iVar3 = 0;
  AVar4 = local_80;
  while( true ) {
    bVar1 = hasNext(&local_80,affixPattern);
    if (!bVar1) {
      return iVar3;
    }
    tag._8_8_ = affixPattern;
    tag.offset = (int)AVar4._8_8_;
    tag.codePoint = (int)((ulong)AVar4._8_8_ >> 0x20);
    AVar4 = nextToken(AVar4._0_8_,tag,(UnicodeString *)status,in_R8);
    if (U_ZERO_ERROR < *status) break;
    local_80 = AVar4;
    if (AVar4.type == TYPE_CURRENCY_OVERFLOW) {
      iVar3 = iVar3 + 1;
    }
    else if (AVar4._8_8_ < 0) {
      (*provider->_vptr_SymbolProvider[2])(&local_70);
      uVar2 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar2 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = iVar3 + uVar2;
      icu_63::UnicodeString::~UnicodeString(&local_70);
    }
    else {
      iVar3 = (iVar3 - (uint)(AVar4._0_8_ >> 0x30 == 0)) + 2;
    }
  }
  return iVar3;
}

Assistant:

int32_t AffixUtils::unescapedCodePointCount(const UnicodeString &affixPattern,
                                            const SymbolProvider &provider, UErrorCode &status) {
    int32_t length = 0;
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return length; }
        if (tag.type == TYPE_CURRENCY_OVERFLOW) {
            length += 1;
        } else if (tag.type < 0) {
            length += provider.getSymbol(tag.type).length();
        } else {
            length += U16_LENGTH(tag.codePoint);
        }
    }
    return length;
}